

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O2

void dill_raw_putreg(dill_stream_conflict s,dill_reg reg,int type)

{
  private_ctx pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 1L << ((byte)reg & 0x3f);
  pdVar1 = s->p;
  if (type - 9U < 2) {
    if (((pdVar1->tmp_f).members[0] & uVar3) != 0) {
LAB_00107c71:
      dill_alloc_specific(s,reg,type,1);
      return;
    }
    uVar2 = (pdVar1->var_f).members[0];
    if ((uVar2 & uVar3) != 0) {
LAB_00107c82:
      dill_alloc_specific(s,reg,type,0);
      return;
    }
    if (reg == -1 && uVar2 == 0) {
      return;
    }
  }
  else {
    if (((pdVar1->tmp_i).members[0] & uVar3) != 0) goto LAB_00107c71;
    if (((pdVar1->var_i).members[0] & uVar3) != 0) goto LAB_00107c82;
  }
  printf("Putreg not in set error %d\n");
  return;
}

Assistant:

extern void
dill_raw_putreg(dill_stream s, dill_reg reg, int type)
{
    switch (type) {
    case DILL_F:
    case DILL_D:
        if (BIT_ON(reg, s->p->tmp_f.members)) {
            dill_alloc_specific(s, reg, type, DILL_TEMP);
        } else if (BIT_ON(reg, s->p->var_f.members)) {
            dill_alloc_specific(s, reg, type, DILL_VAR);
        } else {
            /*
             * special case, if the put reg is invalid (-1) and
             * the member set is empty, give no warning.
             */
            if ((s->p->var_f.members[0] != 0) || (reg != -1)) {
                printf("Putreg not in set error %d\n", reg);
            }
        }
        break;
    default:
        if (BIT_ON(reg, s->p->tmp_i.members)) {
            dill_alloc_specific(s, reg, type, DILL_TEMP);
        } else if (BIT_ON(reg, s->p->var_i.members)) {
            dill_alloc_specific(s, reg, type, DILL_VAR);
        } else {
            printf("Putreg not in set error %d\n", reg);
        }
        break;
    }
}